

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

CBlockLocator * GetLocator(Chain *chain,uint256 *block_hash)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  FoundBlock *pFVar4;
  undefined8 in_RDX;
  long *in_RSI;
  FoundBlock *in_RDI;
  long in_FS_OFFSET;
  bool found;
  CBlockLocator *locator;
  FoundBlock *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockLocator::CBlockLocator((CBlockLocator *)in_stack_ffffffffffffff38);
  interfaces::FoundBlock::FoundBlock(in_stack_ffffffffffffff38);
  pFVar4 = interfaces::FoundBlock::locator
                     (in_RDI,(CBlockLocator *)
                             CONCAT17(in_stack_ffffffffffffff47,
                                      CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40))
                     );
  bVar2 = (**(code **)(*in_RSI + 0x50))(in_RSI,in_RDX,pFVar4);
  if ((bVar2 & 1) == 0) {
    __assert_fail("found",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
                  ,0x29,"CBlockLocator GetLocator(interfaces::Chain &, const uint256 &)");
  }
  bVar3 = CBlockLocator::IsNull((CBlockLocator *)in_stack_ffffffffffffff38);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
      __stack_chk_fail();
    }
    return (CBlockLocator *)in_RDI;
  }
  __assert_fail("!locator.IsNull()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/index/base.cpp"
                ,0x2a,"CBlockLocator GetLocator(interfaces::Chain &, const uint256 &)");
}

Assistant:

CBlockLocator GetLocator(interfaces::Chain& chain, const uint256& block_hash)
{
    CBlockLocator locator;
    bool found = chain.findBlock(block_hash, interfaces::FoundBlock().locator(locator));
    assert(found);
    assert(!locator.IsNull());
    return locator;
}